

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgettextcontrol.cpp
# Opt level: O1

bool __thiscall
QWidgetTextControl::canInsertFromMimeData(QWidgetTextControl *this,QMimeData *source)

{
  int *piVar1;
  bool bVar2;
  bool bVar3;
  char cVar4;
  char cVar5;
  undefined1 uVar6;
  long in_FS_OFFSET;
  QByteArrayView QVar7;
  QByteArrayView QVar8;
  undefined4 local_98;
  undefined4 uStack_94;
  undefined4 local_78;
  undefined4 uStack_74;
  QArrayData *local_60;
  long local_50;
  undefined4 local_48;
  undefined4 uStack_44;
  long local_38;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  cVar5 = *(char *)(*(long *)(this + 8) + 0x111);
  cVar4 = QMimeData::hasText();
  if (cVar5 == '\x01') {
    if ((cVar4 == '\0') || (QMimeData::text(), local_50 == 0)) {
      cVar5 = QMimeData::hasHtml();
      if (cVar5 == '\0') {
        QVar7.m_data = (storage_type *)0x17;
        QVar7.m_size = (qsizetype)&local_48;
        QString::fromLatin1(QVar7);
        local_78 = local_48;
        uStack_74 = uStack_44;
        cVar5 = (**(code **)(*(long *)source + 0x60))(source);
        if (cVar5 != '\0') {
          bVar3 = true;
          goto LAB_004cfae7;
        }
        QVar8.m_data = (storage_type *)0x19;
        QVar8.m_size = (qsizetype)&local_48;
        QString::fromLatin1(QVar8);
        local_98 = local_48;
        uStack_94 = uStack_44;
        uVar6 = (**(code **)(*(long *)source + 0x60))(source);
        bVar3 = true;
        bVar2 = true;
      }
      else {
        uVar6 = 1;
        bVar3 = false;
        bVar2 = false;
      }
    }
    else {
      cVar4 = '\x01';
      bVar3 = false;
LAB_004cfae7:
      bVar2 = false;
      uVar6 = 1;
    }
    if ((bVar2) && (piVar1 = (int *)CONCAT44(uStack_94,local_98), piVar1 != (int *)0x0)) {
      LOCK();
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        QArrayData::deallocate((QArrayData *)CONCAT44(uStack_94,local_98),2,0x10);
      }
    }
    if ((bVar3) && (piVar1 = (int *)CONCAT44(uStack_74,local_78), piVar1 != (int *)0x0)) {
      LOCK();
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        QArrayData::deallocate((QArrayData *)CONCAT44(uStack_74,local_78),2,0x10);
      }
    }
    if ((cVar4 == '\0') || (local_60 == (QArrayData *)0x0)) goto LAB_004cfb9d;
    LOCK();
    (local_60->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_60->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_60->ref_)._q_value.super___atomic_base<int>._M_i != 0) goto LAB_004cfb9d;
  }
  else {
    if (cVar4 == '\0') {
      uVar6 = 0;
      goto LAB_004cfb9d;
    }
    QMimeData::text();
    uVar6 = local_38 != 0;
    piVar1 = (int *)CONCAT44(uStack_44,local_48);
    if (piVar1 == (int *)0x0) goto LAB_004cfb9d;
    LOCK();
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 != 0) goto LAB_004cfb9d;
    local_60 = (QArrayData *)CONCAT44(uStack_44,local_48);
  }
  QArrayData::deallocate(local_60,2,0x10);
LAB_004cfb9d:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return (bool)uVar6;
  }
  __stack_chk_fail();
}

Assistant:

bool QWidgetTextControl::canInsertFromMimeData(const QMimeData *source) const
{
    Q_D(const QWidgetTextControl);
    if (d->acceptRichText)
        return (source->hasText() && !source->text().isEmpty())
            || source->hasHtml()
            || source->hasFormat("application/x-qrichtext"_L1)
            || source->hasFormat("application/x-qt-richtext"_L1);
    else
        return source->hasText() && !source->text().isEmpty();
}